

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O0

void __thiscall ABasicArmor::Serialize(ABasicArmor *this,FArchive *arc)

{
  FArchive *pFVar1;
  FArchive *arc_local;
  ABasicArmor *this_local;
  
  AInventory::Serialize((AInventory *)this,arc);
  pFVar1 = FArchive::operator<<(arc,&this->SavePercent);
  pFVar1 = FArchive::operator<<(pFVar1,&this->BonusCount);
  pFVar1 = FArchive::operator<<(pFVar1,&this->MaxAbsorb);
  pFVar1 = FArchive::operator<<(pFVar1,&this->MaxFullAbsorb);
  pFVar1 = FArchive::operator<<(pFVar1,(SDWORD *)&(this->super_AArmor).super_AInventory.field_0x4dc)
  ;
  pFVar1 = FArchive::operator<<(pFVar1,&(this->ArmorType).super_FName);
  FArchive::operator<<(pFVar1,&this->ActualSaveAmount);
  return;
}

Assistant:

void ABasicArmor::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << SavePercent << BonusCount << MaxAbsorb << MaxFullAbsorb << AbsorbCount << ArmorType << ActualSaveAmount;
}